

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<char_const*,int,unsigned_int>
               (IsoForest *model,char **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  ushort uVar1;
  ushort *puVar2;
  ushort uVar3;
  double *pdVar4;
  vector<IsoTree,_std::allocator<IsoTree>_> *pvVar5;
  ScoringMetric SVar6;
  pointer pIVar7;
  IsoTree *node;
  pointer node_00;
  vector<IsoTree,_std::allocator<IsoTree>_> *tree;
  vector<IsoTree,_std::allocator<IsoTree>_> *this;
  ulong uVar8;
  size_t veclen;
  double data_doubles [2];
  size_t data_sizets [2];
  size_type local_60;
  double local_58;
  double dStack_50;
  size_t local_48;
  size_type local_40;
  
  if (!interrupt_switch) {
    puVar2 = (ushort *)*in;
    uVar1 = *puVar2;
    uVar3 = puVar2[1];
    if (lacks_range_penalty) {
      pdVar4 = (double *)((long)puVar2 + 3);
    }
    else {
      pdVar4 = (double *)(puVar2 + 2);
      model->has_range_penalty = *(char *)((long)puVar2 + 3) != '\0';
    }
    *in = (char *)pdVar4;
    uVar8 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
    model->new_cat_action = (int)uVar8;
    model->cat_split_type = (int)(uVar8 >> 0x20);
    model->missing_action = (uint)(byte)uVar3;
    SVar6 = Depth;
    if (!lacks_scoring_metric) {
      SVar6 = (ScoringMetric)*(byte *)pdVar4;
      pdVar4 = (double *)((long)pdVar4 + 1);
      *in = (char *)pdVar4;
    }
    model->scoring_metric = SVar6;
    local_58 = *pdVar4;
    dStack_50 = pdVar4[1];
    *in = (char *)(pdVar4 + 2);
    if (diff_endian) {
      swap_endianness<double>(&local_58,2);
    }
    model->exp_avg_depth = local_58;
    model->exp_avg_sep = dStack_50;
    read_bytes<unsigned_long,unsigned_int>(&local_48,2,in,buffer,diff_endian);
    model->orig_sample_size = local_48;
    std::
    vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
    ::resize(&model->trees,local_40);
    pvVar5 = (model->trees).
             super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pvVar5 != (model->trees).
                  super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>,_true>
      ::_S_do_it(&model->trees);
      pvVar5 = (model->trees).
               super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    for (this = (model->trees).
                super__Vector_base<std::vector<IsoTree,_std::allocator<IsoTree>_>,_std::allocator<std::vector<IsoTree,_std::allocator<IsoTree>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; this != pvVar5; this = this + 1) {
      read_bytes<unsigned_long,unsigned_int>(&local_60,1,in,buffer,diff_endian);
      std::vector<IsoTree,_std::allocator<IsoTree>_>::resize(this,local_60);
      pIVar7 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (pIVar7 != (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                    super__Vector_impl_data._M_finish) {
        std::__shrink_to_fit_aux<std::vector<IsoTree,_std::allocator<IsoTree>_>,_true>::_S_do_it
                  (this);
        pIVar7 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      for (node_00 = (this->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                     super__Vector_impl_data._M_start; node_00 != pIVar7; node_00 = node_00 + 1) {
        deserialize_node<char_const*,int,unsigned_int>(node_00,in,buffer,diff_endian);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(IsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.trees.resize(data_sizets[1]);
    model.trees.shrink_to_fit();

    size_t veclen;
    for (auto &tree : model.trees) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer, diff_endian);
    }
}